

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O0

int __thiscall
Centaurus::CATNMachine<wchar_t>::import_literal_terminal
          (CATNMachine<wchar_t> *this,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *literal,
          int origin,int tag)

{
  bool bVar1;
  reference pwVar2;
  CharClass<wchar_t> local_60;
  wchar_t local_3c;
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  _Stack_38;
  wchar_t ch;
  const_iterator __end0;
  const_iterator __begin0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *__range2;
  int tag_local;
  int origin_local;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *literal_local;
  CATNMachine<wchar_t> *this_local;
  
  __end0._M_current = (wchar_t *)std::__cxx11::wstring::begin();
  _Stack_38._M_current = (wchar_t *)std::__cxx11::wstring::end();
  __range2._0_4_ = tag;
  __range2._4_4_ = origin;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end0,&stack0xffffffffffffffc8);
    if (!bVar1) break;
    pwVar2 = __gnu_cxx::
             __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
             ::operator*(&__end0);
    local_3c = *pwVar2;
    CharClass<wchar_t>::CharClass(&local_60,local_3c,local_3c + L'\x01');
    __range2._4_4_ = add_node(this,&local_60,__range2._4_4_,(int)__range2);
    CharClass<wchar_t>::~CharClass(&local_60);
    __range2._0_4_ = 0;
    __gnu_cxx::
    __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::operator++(&__end0);
  }
  return __range2._4_4_;
}

Assistant:

int import_literal_terminal(const std::basic_string<TCHAR>& literal, int origin, int tag)
    {
        for (TCHAR ch : literal)
        {
            origin = add_node(CharClass<TCHAR>(ch, ch + 1), origin, tag);
            tag = 0;
        }
        return origin;
    }